

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O1

QVector<int> * __thiscall
InsertProxyModelPrivate::setDataInContainer
          (QVector<int> *__return_storage_ptr__,InsertProxyModelPrivate *this,
          RolesContainer *baseHash,int role,QVariant *value)

{
  char cVar1;
  iterator afirst;
  const_iterator alast;
  int *key;
  QVector<int> adjRoles;
  ulong local_50;
  QList<int> local_48;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  local_48.d.size = 0;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (key_type *)0x0;
  QList<int>::reserve(&local_48,2);
  QList<int>::reserve(__return_storage_ptr__,2);
  local_50 = CONCAT44(local_50._4_4_,role);
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)&local_48,local_48.d.size,(int *)&local_50);
  if ((this->m_separateEditDisplay == false) && ((role & 0xfffffffdU) == 0)) {
    local_50 = CONCAT44(local_50._4_4_,(uint)(role == 0) * 2);
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&local_48,local_48.d.size,(int *)&local_50);
  }
  if (local_48.d.size != 0) {
    key = local_48.d.ptr;
    do {
      afirst = QMap<int,_QVariant>::find(baseHash,key);
      QMap<int,_QVariant>::detach(baseHash);
      if (afirst.i._M_node == (iterator)&(((baseHash->d).d)->m)._M_t._M_impl.super__Rb_tree_header)
      {
        local_50 = *(ulong *)&(value->d).field_0x18 & 0xfffffffffffffffc;
        cVar1 = QMetaType::isValid();
        if (cVar1 != '\0') {
          QMap<int,_QVariant>::detach(baseHash);
          std::map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>::
          insert_or_assign<QVariant_const&>
                    ((map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>
                      *)&((baseHash->d).d)->m,key,value);
          local_50 = CONCAT44(local_50._4_4_,*key);
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                     (int *)&local_50);
        }
      }
      else {
        local_50 = *(ulong *)&(value->d).field_0x18 & 0xfffffffffffffffc;
        cVar1 = QMetaType::isValid();
        if (cVar1 == '\0') {
          alast.i._M_node =
               (const_iterator)std::_Rb_tree_increment((_Rb_tree_node_base *)afirst.i._M_node);
          QMap<int,_QVariant>::erase(baseHash,(const_iterator)afirst.i._M_node,alast);
          local_50 = CONCAT44(local_50._4_4_,*key);
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                     (int *)&local_50);
        }
        else {
          cVar1 = ::QVariant::equals((QVariant *)((long)afirst.i._M_node + 0x28));
          if (cVar1 == '\0') {
            ::QVariant::operator=((QVariant *)((long)afirst.i._M_node + 0x28),value);
            local_50 = CONCAT44(local_50._4_4_,*key);
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                       (int *)&local_50);
          }
        }
      }
      key = key + 1;
    } while (key != local_48.d.ptr + local_48.d.size);
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,4,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QVector<int> InsertProxyModelPrivate::setDataInContainer(RolesContainer &baseHash, int role, const QVariant &value)
{
    QVector<int> changedRoles;
    QVector<int> adjRoles;
    adjRoles.reserve(2);
    changedRoles.reserve(2);
    adjRoles.append(role);
    if ((!m_separateEditDisplay) && (role == Qt::DisplayRole || role == Qt::EditRole))
        adjRoles.append(role == Qt::DisplayRole ? Qt::EditRole : Qt::DisplayRole);
    for (auto adjRole = adjRoles.cbegin(); adjRole != adjRoles.cend(); ++adjRole) {
        const auto dataIter = baseHash.find(*adjRole);
        if (dataIter == baseHash.end()) {
            if (!value.isValid())
                continue;
            baseHash.insert(*adjRole, value);
            changedRoles.append(*adjRole);
        } else {
            Q_ASSERT(dataIter.value().isValid());
            if (!value.isValid()) {
                baseHash.erase(dataIter);
                changedRoles.append(*adjRole);
            } else {
                if (dataIter.value() != value) {
                    dataIter.value() = value;
                    changedRoles.append(*adjRole);
                }
            }
        }
    }
    return changedRoles;
}